

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

ch_string * ch_substring(ch_context *vm,ch_string *target,size_t start,size_t end)

{
  size_t __n;
  char *value_00;
  char *value;
  size_t size;
  size_t end_local;
  size_t start_local;
  ch_string *target_local;
  ch_context *vm_local;
  
  if (((start < end) && (start < target->size)) && (end <= target->size)) {
    __n = end - start;
    value_00 = (char *)malloc(__n + 1);
    memcpy(value_00,target->value + start,__n);
    value_00[__n] = '\0';
    vm_local = (ch_context *)register_allocated_string(vm,value_00,__n);
  }
  else {
    vm_local = (ch_context *)0x0;
  }
  return (ch_string *)vm_local;
}

Assistant:

ch_string *ch_substring(ch_context *vm, ch_string* target, size_t start, size_t end) {
  if (end <= start || start >= target->size || end > target->size) return NULL;
  size_t size = end - start;
  char *value = (char*) malloc(size + 1);
  memcpy(value, &target->value[start], size);
  value[size] = '\0';

  return register_allocated_string(vm, value, size);
}